

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest2::getTessellationControlShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest2 *this,_shader_stage *referencing_stage)

{
  ostream *poVar1;
  char *this_00;
  stringstream result;
  string local_1c0;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = 
  "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout(vertices = 4) out;\n\nsubroutine void testSubroutineType(out vec4 test_argument);\n\nsubroutine(testSubroutineType) void tc_subroutine(out vec4 test_argument)\n{\n    test_argument = vec4(0, 0, 1, 0);\n}\n\nsubroutine uniform testSubroutineType test_tc_subroutine;\n\nvoid main()\n{\n    "
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout(vertices = 4) out;\n\nsubroutine void testSubroutineType(out vec4 test_argument);\n\nsubroutine(testSubroutineType) void tc_subroutine(out vec4 test_argument)\n{\n    test_argument = vec4(0, 0, 1, 0);\n}\n\nsubroutine uniform testSubroutineType test_tc_subroutine;\n\nvoid main()\n{\n    "
             ,0x157);
  getSubroutineUniformName_abi_cxx11_(&local_1c0,(NegativeTest2 *)this_00,referencing_stage);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"(gl_out[gl_InvocationID].gl_Position);\n}\n",0x29);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest2::getTessellationControlShaderBody(const Utils::_shader_stage& referencing_stage) const
{
	std::stringstream result;

	/* Form the pre-amble */
	result << "#version 400\n"
			  "\n"
			  "#extension GL_ARB_shader_subroutine : require\n"
			  "\n"
			  "layout(vertices = 4) out;\n"
			  "\n"
			  "subroutine void testSubroutineType(out vec4 test_argument);\n"
			  "\n"
			  /* Define a subroutine */
			  "subroutine(testSubroutineType) void tc_subroutine(out vec4 test_argument)\n"
			  "{\n"
			  "    test_argument = vec4(0, 0, 1, 0);\n"
			  "}\n"
			  "\n"
			  /* Define uniforms */
			  "subroutine uniform testSubroutineType test_tc_subroutine;\n"
			  "\n"
			  /* Define main() */
			  "void main()\n"
			  "{\n"
			  "    "
		   << getSubroutineUniformName(referencing_stage) << "(gl_out[gl_InvocationID].gl_Position);\n"
															 "}\n";

	return result.str();
}